

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O3

void aiMultiplyMatrix4(aiMatrix4x4 *dst,aiMatrix4x4 *src)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  if (dst == (aiMatrix4x4 *)0x0) {
    __assert_fail("__null != dst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Assimp.cpp"
                  ,0x283,"void aiMultiplyMatrix4(aiMatrix4x4 *, const aiMatrix4x4 *)");
  }
  if (src != (aiMatrix4x4 *)0x0) {
    fVar1 = dst->a1;
    fVar2 = dst->a2;
    fVar3 = dst->a3;
    fVar4 = dst->a4;
    fVar17 = src->a1;
    fVar18 = src->a2;
    fVar19 = src->a3;
    fVar20 = src->a4;
    fVar21 = src->b1;
    fVar22 = src->b2;
    fVar23 = src->b3;
    fVar24 = src->b4;
    fVar25 = src->c1;
    fVar26 = src->c2;
    fVar27 = src->c3;
    fVar28 = src->c4;
    fVar29 = src->d1;
    fVar30 = src->d2;
    fVar31 = src->d3;
    fVar32 = src->d4;
    fVar5 = dst->b2;
    fVar6 = dst->b1;
    fVar7 = dst->b3;
    fVar8 = dst->b4;
    fVar9 = dst->c2;
    fVar10 = dst->c1;
    fVar11 = dst->c3;
    fVar12 = dst->c4;
    fVar13 = dst->d2;
    fVar14 = dst->d1;
    fVar15 = dst->d3;
    fVar16 = dst->d4;
    dst->a1 = fVar4 * fVar29 + fVar3 * fVar25 + fVar1 * fVar17 + fVar2 * fVar21;
    dst->a2 = fVar4 * fVar30 + fVar3 * fVar26 + fVar1 * fVar18 + fVar2 * fVar22;
    dst->a3 = fVar4 * fVar31 + fVar3 * fVar27 + fVar1 * fVar19 + fVar2 * fVar23;
    dst->a4 = fVar4 * fVar32 + fVar3 * fVar28 + fVar1 * fVar20 + fVar2 * fVar24;
    dst->b1 = fVar8 * fVar29 + fVar7 * fVar25 + fVar6 * fVar17 + fVar5 * fVar21;
    dst->b2 = fVar8 * fVar30 + fVar7 * fVar26 + fVar6 * fVar18 + fVar5 * fVar22;
    dst->b3 = fVar8 * fVar31 + fVar7 * fVar27 + fVar6 * fVar19 + fVar5 * fVar23;
    dst->b4 = fVar8 * fVar32 + fVar7 * fVar28 + fVar6 * fVar20 + fVar5 * fVar24;
    dst->c1 = fVar12 * fVar29 + fVar11 * fVar25 + fVar10 * fVar17 + fVar9 * fVar21;
    dst->c2 = fVar12 * fVar30 + fVar11 * fVar26 + fVar10 * fVar18 + fVar9 * fVar22;
    dst->c3 = fVar12 * fVar31 + fVar11 * fVar27 + fVar10 * fVar19 + fVar9 * fVar23;
    dst->c4 = fVar12 * fVar32 + fVar11 * fVar28 + fVar10 * fVar20 + fVar9 * fVar24;
    dst->d1 = fVar16 * fVar29 + fVar15 * fVar25 + fVar14 * fVar17 + fVar13 * fVar21;
    dst->d2 = fVar16 * fVar30 + fVar15 * fVar26 + fVar14 * fVar18 + fVar13 * fVar22;
    dst->d3 = fVar16 * fVar31 + fVar15 * fVar27 + fVar14 * fVar19 + fVar13 * fVar23;
    dst->d4 = fVar16 * fVar32 + fVar15 * fVar28 + fVar14 * fVar20 + fVar13 * fVar24;
    return;
  }
  __assert_fail("__null != src",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Assimp.cpp"
                ,0x284,"void aiMultiplyMatrix4(aiMatrix4x4 *, const aiMatrix4x4 *)");
}

Assistant:

ASSIMP_API void aiMultiplyMatrix4(
    aiMatrix4x4* dst,
    const aiMatrix4x4* src)
{
    ai_assert( NULL != dst );
    ai_assert( NULL != src );
    *dst = (*dst) * (*src);
}